

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

bool __thiscall
glcts::ProgramUniformCase::setAndCompareUniforms
          (ProgramUniformCase *this,GLuint pipeline,GLuint programA,GLuint programB,DataType dType,
          int seed)

{
  glGetUniformLocationFunc p_Var1;
  int iVar2;
  GLint GVar3;
  TestLog *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  GLchar *pGVar5;
  TestError *pTVar6;
  int *local_520;
  GLfloat local_4a8 [2];
  uint retVal [4];
  GLint *location;
  GLfloat local_488;
  GLuint activeProgram;
  uint retValB_1 [4];
  uint retValA_1 [4];
  uint retValB [4];
  uint retValA [4];
  int **local_440;
  uint *uValue;
  int local_414;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  string name_1;
  undefined1 local_350 [8];
  string name;
  allocator<char> local_199;
  undefined1 local_198 [8];
  string uniformBaseName;
  int local_170;
  int k;
  int j;
  int i;
  float *fdata;
  int *data;
  uint udata [30];
  int local_d8;
  int udataCount;
  GLint locationB [12];
  GLint locationA [12];
  int dwordCount [12];
  int locationCount;
  int arraySize;
  int arrayUnifCount;
  int nonarrayUnifCount;
  Functions *gl;
  TestLog *log;
  int seed_local;
  DataType dType_local;
  GLuint programB_local;
  GLuint programA_local;
  GLuint pipeline_local;
  ProgramUniformCase *this_local;
  Functions *gl_00;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  locationA[10] = 1;
  locationA[0xb] = 2;
  udata[0x1d] = 0x1e;
  _j = &data;
  fdata = (float *)_j;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_198,"uVal",&local_199);
  std::allocator<char>::~allocator(&local_199);
  tcu::TestLog::operator<<
            ((MessageBuilder *)((long)&name.field_2 + 8),this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)((long)&name.field_2 + 8),
                       (char (*) [33])"Begin:ProgramUniformCase iterate");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)((long)&name.field_2 + 8));
  for (k = 0; k < 4; k = k + 1) {
    de::toString<int>((string *)((long)&name_1.field_2 + 8),&k);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&name_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(name_1.field_2._M_local_buf + 8));
    p_Var1 = gl_00->getUniformLocation;
    pGVar5 = (GLchar *)std::__cxx11::string::c_str();
    GVar3 = (*p_Var1)(programA,pGVar5);
    locationB[(long)k + 10] = GVar3;
    p_Var1 = gl_00->getUniformLocation;
    pGVar5 = (GLchar *)std::__cxx11::string::c_str();
    GVar3 = (*p_Var1)(programB,pGVar5);
    (&local_d8)[k] = GVar3;
    std::__cxx11::string::~string((string *)local_350);
  }
  for (local_170 = 0; local_170 < 4; local_170 = local_170 + 1) {
    for (uniformBaseName.field_2._12_4_ = 0; (int)uniformBaseName.field_2._12_4_ < 2;
        uniformBaseName.field_2._12_4_ = uniformBaseName.field_2._12_4_ + 1) {
      local_414 = local_170 + 4;
      de::toString<int>(&local_410,&local_414);
      std::operator+(&local_3f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     &local_410);
      std::operator+(&local_3d0,&local_3f0,"[");
      de::toString<int>((string *)&uValue,(int *)(uniformBaseName.field_2._M_local_buf + 0xc));
      std::operator+(&local_3b0,&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uValue);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_3b0,"]");
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&uValue);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      p_Var1 = gl_00->getUniformLocation;
      pGVar5 = (GLchar *)std::__cxx11::string::c_str();
      GVar3 = (*p_Var1)(programA,pGVar5);
      locationB[(long)k + 10] = GVar3;
      p_Var1 = gl_00->getUniformLocation;
      pGVar5 = (GLchar *)std::__cxx11::string::c_str();
      GVar3 = (*p_Var1)(programB,pGVar5);
      (&local_d8)[k] = GVar3;
      k = k + 1;
      std::__cxx11::string::~string((string *)local_390);
    }
  }
  if (dType == TYPE_FLOAT) {
    for (k = 0; k < 0x1e; k = k + 1) {
      *(float *)((long)_j + (long)k * 4) = (float)(seed + k);
    }
  }
  else {
    for (k = 0; k < 0x1e; k = k + 1) {
      fdata[k] = (float)(seed + k);
    }
  }
  if (dType == TYPE_INT) {
    progUniformi(this,gl_00,programA,2,locationB + 10,(int *)fdata);
  }
  else if (dType == TYPE_UINT) {
    progUniformui(this,gl_00,programA,2,locationB + 10,(uint *)&data);
  }
  else if (dType == TYPE_FLOAT) {
    progUniformf(this,gl_00,programA,2,locationB + 10,(float *)_j);
  }
  local_440 = &data;
  k = 0;
  do {
    if (0xb < k) {
      if (dType == TYPE_FLOAT) {
        *(float *)_j = *(float *)((long)_j + 0x74) + 1.0;
        for (k = 1; k < 0x1e; k = k + 1) {
          *(float *)((long)_j + (long)k * 4) = *(float *)((long)_j + (long)(k + -1) * 4) + 1.0;
        }
      }
      else {
        *fdata = (float)((int)fdata[0x1d] + 1);
        for (k = 1; k < 0x1e; k = k + 1) {
          fdata[k] = (float)((int)fdata[k + -1] + 1);
        }
      }
      if (dType == TYPE_INT) {
        progUniformi(this,gl_00,programB,2,&local_d8,(int *)fdata);
      }
      else if (dType == TYPE_UINT) {
        progUniformui(this,gl_00,programB,2,&local_d8,(uint *)&data);
      }
      else if (dType == TYPE_FLOAT) {
        progUniformf(this,gl_00,programB,2,&local_d8,(float *)_j);
      }
      local_440 = &data;
      k = 0;
      do {
        if (0xb < k) {
          location._4_4_ = 0;
          if (pipeline != 0) {
            (*gl_00->getProgramPipelineiv)(pipeline,0x8259,(GLint *)((long)&location + 4));
          }
          if ((location._4_4_ != 0) &&
             ((location._4_4_ == programA || (location._4_4_ == programB)))) {
            if (location._4_4_ == programA) {
              local_520 = locationB + 10;
            }
            else {
              local_520 = &local_d8;
            }
            retVal._8_8_ = local_520;
            if (dType == TYPE_FLOAT) {
              *(float *)_j = *(float *)((long)_j + 0x74) + 1.0;
              for (k = 1; k < 0x1e; k = k + 1) {
                *(float *)((long)_j + (long)k * 4) = *(float *)((long)_j + (long)(k + -1) * 4) + 1.0
                ;
              }
            }
            else {
              *fdata = (float)((int)fdata[0x1d] + 1);
              for (k = 1; k < 0x1e; k = k + 1) {
                fdata[k] = (float)((int)fdata[k + -1] + 1);
              }
            }
            if (dType == TYPE_INT) {
              activeUniformi(this,gl_00,2,local_520,(int *)fdata);
            }
            else if (dType == TYPE_UINT) {
              activeUniformui(this,gl_00,2,local_520,(uint *)&data);
            }
            else if (dType == TYPE_FLOAT) {
              activeUniformf(this,gl_00,2,local_520,(float *)_j);
            }
            local_440 = &data;
            for (k = 0; k < 0xc; k = k + 1) {
              if (dType == TYPE_INT) {
                (*gl_00->getUniformiv)
                          (location._4_4_,*(GLint *)(retVal._8_8_ + (long)k * 4),(GLint *)local_4a8)
                ;
              }
              else if (dType == TYPE_UINT) {
                (*gl_00->getUniformuiv)
                          (location._4_4_,*(GLint *)(retVal._8_8_ + (long)k * 4),(GLuint *)local_4a8
                          );
              }
              else if (dType == TYPE_FLOAT) {
                (*gl_00->getUniformfv)
                          (location._4_4_,*(GLint *)(retVal._8_8_ + (long)k * 4),local_4a8);
              }
              for (local_170 = 0; local_170 < locationA[(long)k + 10]; local_170 = local_170 + 1) {
                if (local_4a8[local_170] != *(GLfloat *)local_440) {
                  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar6,"ActiveShaderProgram failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x663);
                  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
                local_440 = (int **)((long)local_440 + 4);
              }
            }
          }
          std::__cxx11::string::~string((string *)local_198);
          return true;
        }
        if (dType == TYPE_INT) {
          (*gl_00->getUniformiv)(programA,locationB[(long)k + 10],(GLint *)(retValB_1 + 2));
          (*gl_00->getUniformiv)(programB,(&local_d8)[k],(GLint *)&local_488);
        }
        else if (dType == TYPE_UINT) {
          (*gl_00->getUniformuiv)(programA,locationB[(long)k + 10],retValB_1 + 2);
          (*gl_00->getUniformuiv)(programB,(&local_d8)[k],(GLuint *)&local_488);
        }
        else if (dType == TYPE_FLOAT) {
          (*gl_00->getUniformfv)(programA,locationB[(long)k + 10],(GLfloat *)(retValB_1 + 2));
          (*gl_00->getUniformfv)(programB,(&local_d8)[k],&local_488);
        }
        for (local_170 = 0; local_170 < locationA[(long)k + 10]; local_170 = local_170 + 1) {
          if (((&local_488)[local_170] != *(GLfloat *)local_440) ||
             ((GLfloat)retValB_1[(long)local_170 + 2] == (&local_488)[local_170])) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"ProgramUniformi failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x619);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          local_440 = (int **)((long)local_440 + 4);
        }
        k = k + 1;
      } while( true );
    }
    if (dType == TYPE_INT) {
      (*gl_00->getUniformiv)(programA,locationB[(long)k + 10],(GLint *)(retValB + 2));
      (*gl_00->getUniformiv)(programB,(&local_d8)[k],(GLint *)(retValA_1 + 2));
    }
    else if (dType == TYPE_UINT) {
      (*gl_00->getUniformuiv)(programA,locationB[(long)k + 10],retValB + 2);
      (*gl_00->getUniformuiv)(programB,(&local_d8)[k],retValA_1 + 2);
    }
    else if (dType == TYPE_FLOAT) {
      (*gl_00->getUniformfv)(programA,locationB[(long)k + 10],(GLfloat *)(retValB + 2));
      (*gl_00->getUniformfv)(programB,(&local_d8)[k],(GLfloat *)(retValA_1 + 2));
    }
    for (local_170 = 0; local_170 < locationA[(long)k + 10]; local_170 = local_170 + 1) {
      if ((retValB[(long)local_170 + 2] != *(uint *)local_440) ||
         (retValB[(long)local_170 + 2] == retValA_1[(long)local_170 + 2])) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x5d7);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_440 = (int **)((long)local_440 + 4);
    }
    k = k + 1;
  } while( true );
}

Assistant:

bool setAndCompareUniforms(glw::GLuint pipeline, glw::GLuint programA, glw::GLuint programB, glu::DataType dType,
							   int seed)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		// The fragment shader has defined uniforms of type:
		// scalar, vec2, vec3, vec4, and then length 2 arrays of
		// scalar, vec2, vec3, and vec4.
		// 4 uniforms in array form and 4 not in arrays.
		// We query a total of 12 uniform locations
		const int nonarrayUnifCount = 4;
		const int arrayUnifCount	= 4;
		const int arraySize			= 2;
		const int locationCount		= nonarrayUnifCount + arraySize * arrayUnifCount;
		// dwordCount represents the number of dwords to compare for each uniform location
		// scalar, vec2, vec3, vec4, scalar[0], scalar[1], vec2[0], vec2[1], etc.
		const int  dwordCount[locationCount] = { 1, 2, 3, 4, 1, 1, 2, 2, 3, 3, 4, 4 };
		glw::GLint locationA[locationCount];
		glw::GLint locationB[locationCount];
		// The total amount of data the uniforms take up: 1+2+3+4 + 2*(1+2+3+4)
		const int	udataCount = 30;
		unsigned int udata[udataCount]; //
		int*		 data  = (int*)&udata[0];
		float*		 fdata = (float*)&udata[0];
		int			 i, j, k;
		std::string  uniformBaseName("uVal");

		// ProgramUniform API verification
		log << TestLog::Message << "Begin:ProgramUniformCase iterate" << TestLog::EndMessage;

		// get uniform locations
		// scalar and vec uniforms
		for (i = 0; i < nonarrayUnifCount; i++)
		{
			string name  = uniformBaseName + de::toString(i);
			locationA[i] = gl.getUniformLocation(programA, name.c_str());
			locationB[i] = gl.getUniformLocation(programB, name.c_str());
		}
		// uniform arrays
		for (j = 0; j < arrayUnifCount; j++)
		{
			for (k = 0; k < arraySize; k++)
			{
				string name  = uniformBaseName + de::toString(nonarrayUnifCount + j) + "[" + de::toString(k) + "]";
				locationA[i] = gl.getUniformLocation(programA, name.c_str());
				locationB[i] = gl.getUniformLocation(programB, name.c_str());
				i++;
			}
		}

		// seed data buffer with unique values
		if (dType == glu::TYPE_FLOAT)
		{
			for (i = 0; i < udataCount; i++)
			{
				fdata[i] = (float)(seed + i);
			}
		}
		else
		{
			for (i = 0; i < udataCount; i++)
			{
				data[i] = seed + i;
			}
		}

		// set uniforms in program A
		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programA, arraySize, locationA, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programA, arraySize, locationA, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programA, arraySize, locationA, fdata);
		}

		// get and compare uniforms
		unsigned int* uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programA uniform to expected value and
				// test to see if programB picked up the value.
				if ((retValA[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// reseed data buffer, continuing to increment
		if (dType == glu::TYPE_FLOAT)
		{
			fdata[0] = fdata[udataCount - 1] + 1.0f;
			for (i = 1; i < udataCount; i++)
			{
				fdata[i] = fdata[i - 1] + 1.0f;
			}
		}
		else
		{
			data[0] = data[udataCount - 1] + 1;
			for (i = 1; i < udataCount; i++)
			{
				data[i] = data[i - 1] + 1;
			}
		}

		// set uniforms in program B

		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programB, arraySize, locationB, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programB, arraySize, locationB, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programB, arraySize, locationB, fdata);
		}

		// get and compare uniforms
		uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programB uniform to expected value and
				// test to see if programA picked up the value.
				if ((retValB[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// Test the conventional uniform interfaces on an ACTIVE_PROGRAM
		glw::GLuint activeProgram = 0;
		if (pipeline != 0)
		{
			gl.getProgramPipelineiv(pipeline, GL_ACTIVE_PROGRAM, (int*)&activeProgram);
		}
		if ((activeProgram != 0) && ((activeProgram == programA) || (activeProgram == programB)))
		{
			glw::GLint* location;

			location = (activeProgram == programA) ? locationA : locationB;

			// reseed data buffer, continuing to increment
			if (dType == glu::TYPE_FLOAT)
			{
				fdata[0] = fdata[udataCount - 1] + 1.0f;
				for (i = 1; i < udataCount; i++)
				{
					fdata[i] = fdata[i - 1] + 1.0f;
				}
			}
			else
			{
				data[0] = data[udataCount - 1] + 1;
				for (i = 1; i < udataCount; i++)
				{
					data[i] = data[i - 1] + 1;
				}
			}

			// set uniforms using original glUniform*

			if (dType == glu::TYPE_INT)
			{
				activeUniformi(gl, arraySize, location, data);
			}
			else if (dType == glu::TYPE_UINT)
			{
				activeUniformui(gl, arraySize, location, udata);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				activeUniformf(gl, arraySize, location, fdata);
			}

			// get and compare uniforms
			uValue = &udata[0];
			for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
			{
				unsigned int retVal[4];

				if (dType == glu::TYPE_INT)
				{
					gl.getUniformiv(activeProgram, location[i], (int*)&retVal[0]);
				}
				else if (dType == glu::TYPE_UINT)
				{
					gl.getUniformuiv(activeProgram, location[i], &retVal[0]);
				}
				else if (dType == glu::TYPE_FLOAT)
				{
					gl.getUniformfv(activeProgram, location[i], (float*)&retVal[0]);
				}

				for (j = 0; j < dwordCount[i]; j++)
				{
					// Compare activeProgram uniform to expected value
					if ((retVal[j] != *uValue++))
					{
						TCU_FAIL("ActiveShaderProgram failed");
					}
				}
			}
		}

		return true;
	}